

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gssc.c
# Opt level: O1

Ssh_gss_stat ssh_gssapi_release_cred(ssh_gss_library *lib,Ssh_gss_ctx *ctx)

{
  void *ptr;
  OM_uint32 OVar1;
  Ssh_gss_stat SVar2;
  OM_uint32 min_stat;
  OM_uint32 local_1c;
  
  ptr = *ctx;
  if (ptr == (void *)0x0) {
    SVar2 = SSH_GSS_FAILURE;
  }
  else {
    if (*(long *)((long)ptr + 8) == 0) {
      SVar2 = SSH_GSS_OK;
    }
    else {
      OVar1 = (*(lib->u).gssapi.delete_sec_context)
                        (&local_1c,(gss_ctx_id_t *)((long)ptr + 8),(gss_buffer_t)0x0);
      SVar2 = SSH_GSS_FAILURE;
      if (OVar1 == 0) {
        SVar2 = SSH_GSS_OK;
      }
    }
    safefree(ptr);
    *ctx = (Ssh_gss_ctx)0x0;
  }
  return SVar2;
}

Assistant:

static Ssh_gss_stat ssh_gssapi_release_cred(struct ssh_gss_library *lib,
                                            Ssh_gss_ctx *ctx)
{
    struct gssapi_functions *gss = &lib->u.gssapi;
    gssapi_ssh_gss_ctx *gssctx = (gssapi_ssh_gss_ctx *) *ctx;
    OM_uint32 min_stat;
    OM_uint32 maj_stat=GSS_S_COMPLETE;

    if (gssctx == NULL) return SSH_GSS_FAILURE;
    if (gssctx->ctx != GSS_C_NO_CONTEXT)
        maj_stat = gss->delete_sec_context(&min_stat,&gssctx->ctx,GSS_C_NO_BUFFER);
    sfree(gssctx);
    *ctx = NULL;

    if (maj_stat == GSS_S_COMPLETE) return SSH_GSS_OK;
    return SSH_GSS_FAILURE;
}